

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::AddEvaluationFile
          (cmMakefile *this,string *inputFile,auto_ptr<cmCompiledGeneratorExpression> *outputName,
          auto_ptr<cmCompiledGeneratorExpression> *condition,bool inputIsContent)

{
  byte bVar1;
  auto_ptr<cmCompiledGeneratorExpression> *input;
  PolicyStatus policyStatusCMP0070;
  cmGeneratorExpressionEvaluationFile *this_00;
  auto_ptr<cmCompiledGeneratorExpression> local_48;
  auto_ptr<cmCompiledGeneratorExpression> local_40;
  cmGeneratorExpressionEvaluationFile *local_38;
  byte local_29;
  auto_ptr<cmCompiledGeneratorExpression> *paStack_28;
  bool inputIsContent_local;
  auto_ptr<cmCompiledGeneratorExpression> *condition_local;
  auto_ptr<cmCompiledGeneratorExpression> *outputName_local;
  string *inputFile_local;
  cmMakefile *this_local;
  
  local_29 = inputIsContent;
  paStack_28 = condition;
  condition_local = outputName;
  outputName_local = (auto_ptr<cmCompiledGeneratorExpression> *)inputFile;
  inputFile_local = (string *)this;
  this_00 = (cmGeneratorExpressionEvaluationFile *)operator_new(0x50);
  input = outputName_local;
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_40,outputName);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_48,condition);
  bVar1 = local_29;
  policyStatusCMP0070 = GetPolicyStatus(this,CMP0070);
  cmGeneratorExpressionEvaluationFile::cmGeneratorExpressionEvaluationFile
            (this_00,(string *)input,&local_40,&local_48,(bool)(bVar1 & 1),policyStatusCMP0070);
  local_38 = this_00;
  std::
  vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
  ::push_back(&this->EvaluationFiles,&local_38);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_48);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_40);
  return;
}

Assistant:

void cmMakefile::AddEvaluationFile(
  const std::string& inputFile,
  CM_AUTO_PTR<cmCompiledGeneratorExpression> outputName,
  CM_AUTO_PTR<cmCompiledGeneratorExpression> condition, bool inputIsContent)
{
  this->EvaluationFiles.push_back(new cmGeneratorExpressionEvaluationFile(
    inputFile, outputName, condition, inputIsContent,
    this->GetPolicyStatus(cmPolicies::CMP0070)));
}